

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::converter::GetStringOptionOrDefault_abi_cxx11_
          (string *__return_storage_ptr__,converter *this,
          RepeatedPtrField<google::protobuf::Option> *options,StringPiece option_name,
          StringPiece default_value)

{
  Option *pOVar1;
  undefined1 *this_00;
  long lVar2;
  long in_R9;
  StringPiece option_name_00;
  Any *any;
  
  lVar2 = option_name.length_;
  option_name_00.length_ = option_name.ptr_;
  option_name_00.ptr_ = option_name_00.length_;
  pOVar1 = FindOptionOrNull(this,options,option_name_00);
  if (pOVar1 == (Option *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (lVar2 == 0) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,lVar2,in_R9 + lVar2);
    }
  }
  else {
    this_00 = (undefined1 *)pOVar1->value_;
    if ((Any *)this_00 == (Any *)0x0) {
      this_00 = _Any_default_instance_;
    }
    GetStringFromAny_abi_cxx11_(__return_storage_ptr__,(converter *)this_00,any);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetStringOptionOrDefault(
    const RepeatedPtrField<google::protobuf::Option>& options,
    StringPiece option_name, StringPiece default_value) {
  const google::protobuf::Option* opt = FindOptionOrNull(options, option_name);
  if (opt == nullptr) {
    return std::string(default_value);
  }
  return GetStringFromAny(opt->value());
}